

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

uint32_t pkt_buf_alloc_batch(mempool *mempool,pkt_buf **bufs,uint32_t num_bufs)

{
  uint uVar1;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  uint32_t entry_id;
  uint32_t i;
  uint local_18;
  uint local_14;
  
  local_14 = in_EDX;
  if (*(uint *)(in_RDI + 2) < in_EDX) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
            "pkt_buf_alloc_batch",in_RDI,(int)in_RDI[2]);
    local_14 = *(uint *)(in_RDI + 2);
  }
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    uVar1 = (int)in_RDI[2] - 1;
    *(uint *)(in_RDI + 2) = uVar1;
    *(ulong *)(in_RSI + (ulong)local_18 * 8) =
         *in_RDI + (ulong)(uint)(*(int *)((long)in_RDI + (ulong)uVar1 * 4 + 0x14) * (int)in_RDI[1]);
  }
  return local_14;
}

Assistant:

uint32_t pkt_buf_alloc_batch(struct mempool* mempool, struct pkt_buf* bufs[], uint32_t num_bufs) {
	if (mempool->free_stack_top < num_bufs) {
		warn("memory pool %p only has %d free bufs, requested %d", mempool, mempool->free_stack_top, num_bufs);
		num_bufs = mempool->free_stack_top;
	}
	for (uint32_t i = 0; i < num_bufs; i++) {
		uint32_t entry_id = mempool->free_stack[--mempool->free_stack_top];
		bufs[i] = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + entry_id * mempool->buf_size);
	}
	return num_bufs;
}